

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::ast::UnrollVisitor::PerAssignDriverState>::
emplace_back<slang::ast::Expression_const&,slang::ast::ValueSymbol_const&>
          (SmallVectorBase<slang::ast::UnrollVisitor::PerAssignDriverState> *this,Expression *args,
          ValueSymbol *args_1)

{
  size_type sVar1;
  pointer pPVar2;
  
  if (this->len == this->cap) {
    pPVar2 = emplaceRealloc<slang::ast::Expression_const&,slang::ast::ValueSymbol_const&>
                       (this,this->data_ + this->len,args,args_1);
    return pPVar2;
  }
  ast::UnrollVisitor::PerAssignDriverState::PerAssignDriverState
            (this->data_ + this->len,args,args_1);
  sVar1 = this->len;
  this->len = sVar1 + 1;
  return this->data_ + sVar1;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }